

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O1

double raplcap_pd_get_energy_counter(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  uint64_t in_RAX;
  raplcap_msr *ctx;
  int *piVar2;
  off_t msr;
  double dVar3;
  uint64_t msrval;
  uint64_t local_28;
  
  local_28 = in_RAX;
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_ENERGY[zone];
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    msr = -1;
  }
  dVar3 = -1.0;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    iVar1 = msr_sys_read(ctx->sys,&local_28,pkg,die,msr);
    dVar3 = -1.0;
    if (iVar1 == 0) {
      dVar3 = msr_get_energy_counter(&ctx->ctx,local_28,zone);
    }
  }
  return dVar3;
}

Assistant:

double raplcap_pd_get_energy_counter(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_ENERGY);
  raplcap_log(DEBUG, "raplcap_pd_get_energy_counter: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  return msr_get_energy_counter(&state->ctx, msrval, zone);
}